

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureQueryCase::createInstance(TextureQueryCase *this,Context *context)

{
  undefined8 uVar1;
  TestLog *pTVar2;
  TextureSpec *pTVar3;
  VkFormat format;
  uint uVar4;
  int iVar5;
  TextureChannelClass TVar6;
  TextureQueryInstance *pTVar7;
  TextureFormat TVar8;
  InstanceInterface *pIVar9;
  VkPhysicalDevice pVVar10;
  TextureQueryLodInstance *this_00;
  ulong uVar11;
  VkPhysicalDeviceProperties *pVVar12;
  NotSupportedError *this_01;
  IVec3 *pIVar13;
  LodMode mode;
  uint uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  CubeFaceFloatCoords CVar20;
  CubeFaceFloatCoords CVar21;
  CubeFaceFloatCoords CVar22;
  undefined8 in_stack_fffffffffffffde8;
  uint uVar23;
  float local_204;
  IVec3 local_1f8;
  TextureBindingSp textureBinding;
  string local_1d8;
  float local_1b8;
  float local_1b4;
  undefined1 local_1b0 [8];
  float local_1a8 [3];
  uint local_19c;
  Context *this_02;
  
  uVar23 = (uint)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  switch(this->m_function) {
  case QUERYFUNCTION_TEXTURESIZE:
    pTVar7 = (TextureQueryInstance *)operator_new(0x248);
    TextureQueryInstance::TextureQueryInstance
              (pTVar7,context,(this->super_ShaderRenderCase).m_isVertexCase,&this->m_textureSpec);
    (pTVar7->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__ShaderRenderCaseInstance_00bd2ea8;
    *(undefined8 *)&pTVar7[1].super_ShaderRenderCaseInstance = 0;
    pTVar7[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
    pTVar7[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
    pTVar7[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
    *(undefined8 *)
     &pTVar7[1].super_ShaderRenderCaseInstance.m_sparseContext.
      super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
         = 0;
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(pTVar7 + 1));
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)&pTVar7[1].super_ShaderRenderCaseInstance.m_quadGridSize);
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)
               &pTVar7[1].super_ShaderRenderCaseInstance.m_sparseContext.
                super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
                .m_data.field_0x8);
    *(undefined4 *)((long)&pTVar7[1].super_ShaderRenderCaseInstance.m_memAlloc + 4) = 0;
    *(undefined8 *)&pTVar7[1].super_ShaderRenderCaseInstance = 0;
    pTVar7[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
    pTVar7[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
    pTVar7[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
    *(undefined8 *)
     &pTVar7[1].super_ShaderRenderCaseInstance.m_sparseContext.
      super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
         = 0;
    goto LAB_00601d5a;
  case QUERYFUNCTION_TEXTUREQUERYLOD:
    this_00 = (TextureQueryLodInstance *)operator_new(0x248);
    TextureQueryInstance::TextureQueryInstance
              ((TextureQueryInstance *)this_00,context,(this->super_ShaderRenderCase).m_isVertexCase
               ,&this->m_textureSpec);
    (this_00->super_TextureQueryInstance).super_ShaderRenderCaseInstance.super_TestInstance.
    _vptr_TestInstance = (_func_int **)&PTR__ShaderRenderCaseInstance_00bd2f68;
    tcu::Vector<float,_4>::Vector(&this_00->m_minCoord);
    tcu::Vector<float,_4>::Vector(&this_00->m_maxCoord);
    *(undefined8 *)(this_00->m_lodBounds).m_data = 0;
    *(undefined8 *)(this_00->m_levelBounds).m_data = 0;
    pTVar2 = ((this_00->super_TextureQueryInstance).super_ShaderRenderCaseInstance.
              super_TestInstance.m_context)->m_testCtx->m_log;
    pTVar3 = (this_00->super_TextureQueryInstance).m_textureSpec;
    local_1f8.m_data[2] = pTVar3->depth;
    pIVar13 = *(IVec3 **)&pTVar3->width;
    textureBinding.m_ptr = (TextureBinding *)0x0;
    textureBinding.m_state = (SharedPtrStateBase *)0x0;
    local_1b0._0_4_ = SUB84(pTVar2,0);
    local_1b0._4_4_ = (undefined4)((ulong)pTVar2 >> 0x20);
    local_1f8.m_data._0_8_ = pIVar13;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::operator<<((ostream *)local_1a8,"Image size: ");
    sr::(anonymous_namespace)::getTextureSizeString_abi_cxx11_
              (&local_1d8,
               (_anonymous_namespace_ *)
               (ulong)((this_00->super_TextureQueryInstance).m_textureSpec)->type,
               (TextureType)&local_1f8,pIVar13);
    std::operator<<((ostream *)local_1a8,(string *)&local_1d8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    pTVar3 = (this_00->super_TextureQueryInstance).m_textureSpec;
    createEmptyTexture((anon_unknown_0 *)local_1b0,pTVar3->format,pTVar3->type,&local_1f8,
                       pTVar3->numLevels,0,&pTVar3->sampler);
    de::SharedPtr<vkt::sr::TextureBinding>::operator=
              (&textureBinding,(SharedPtr<vkt::sr::TextureBinding> *)local_1b0);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr
              ((SharedPtr<vkt::sr::TextureBinding> *)local_1b0);
    std::
    vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
    ::push_back(&(this_00->super_TextureQueryInstance).super_ShaderRenderCaseInstance.m_textures,
                &textureBinding);
    de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&textureBinding);
    uVar11 = (ulong)((this_00->super_TextureQueryInstance).m_textureSpec)->type;
    if (uVar11 < 7) {
      fVar16 = *(float *)(&DAT_0099a73c + uVar11 * 4);
      fVar17 = *(float *)(&DAT_0099a758 + uVar11 * 4);
      fVar19 = *(float *)(&DAT_0099a774 + uVar11 * 4);
      fVar18 = *(float *)(&DAT_0099a790 + uVar11 * 4);
      (this_00->m_minCoord).m_data[0] = *(float *)(&DAT_0099a720 + uVar11 * 4);
      (this_00->m_minCoord).m_data[1] = fVar16;
      (this_00->m_minCoord).m_data[2] = fVar17;
      (this_00->m_minCoord).m_data[3] = 0.0;
      fVar16 = *(float *)(&DAT_0099a7ac + uVar11 * 4);
      (this_00->m_maxCoord).m_data[0] = fVar19;
      (this_00->m_maxCoord).m_data[1] = fVar18;
      (this_00->m_maxCoord).m_data[2] = fVar16;
      (this_00->m_maxCoord).m_data[3] = 0.0;
    }
    ShaderRenderCaseInstance::getViewportSize((ShaderRenderCaseInstance *)this_00);
    this_02 = (this_00->super_TextureQueryInstance).super_ShaderRenderCaseInstance.
              super_TestInstance.m_context;
    pVVar12 = Context::getDeviceProperties(this_02);
    mode = (LodMode)this_02;
    pTVar3 = (this_00->super_TextureQueryInstance).m_textureSpec;
    if (TEXTURETYPE_CUBE_ARRAY < pTVar3->type) {
      local_204 = (this_00->m_lodBounds).m_data[1];
      goto LAB_006024f3;
    }
    break;
  case QUERYFUNCTION_TEXTUREQUERYLEVELS:
    pTVar7 = (TextureQueryInstance *)operator_new(0x230);
    TextureQueryInstance::TextureQueryInstance
              (pTVar7,context,(this->super_ShaderRenderCase).m_isVertexCase,&this->m_textureSpec);
    (pTVar7->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__ShaderRenderCaseInstance_00bd2fc8;
    *(undefined8 *)&pTVar7[1].super_ShaderRenderCaseInstance = 0;
    pTVar7[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(pTVar7 + 1));
    *(undefined8 *)&pTVar7[1].super_ShaderRenderCaseInstance = 0;
    pTVar7[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
    pTVar7[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
    pTVar7[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
LAB_00601d5a:
    *(undefined8 *)(pTVar7->super_ShaderRenderCaseInstance).m_renderSize.m_data = 0x100000001;
    return (TestInstance *)pTVar7;
  case QUERYFUNCTION_TEXTURESAMPLES:
    pTVar7 = (TextureQueryInstance *)operator_new(0x238);
    TextureQueryInstance::TextureQueryInstance
              (pTVar7,context,(this->super_ShaderRenderCase).m_isVertexCase,&this->m_textureSpec);
    (pTVar7->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
         (_func_int **)&PTR__TextureSamplesInstance_00bd3028;
    *(undefined4 *)&pTVar7[1].super_ShaderRenderCaseInstance = 0;
    *(undefined8 *)
     &pTVar7[1].super_ShaderRenderCaseInstance.m_sparseContext.
      super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
         = 0;
    pTVar7[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
    pTVar7[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
    pTVar7[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
    *(undefined8 *)(pTVar7->super_ShaderRenderCaseInstance).m_renderSize.m_data = 0x100000001;
    TVar8 = glu::mapGLInternalFormat(pTVar7->m_textureSpec->format);
    local_1b0._0_4_ = TVar8.order;
    local_1b0._4_4_ = TVar8.type;
    format = ::vk::mapTextureFormat((TextureFormat *)local_1b0);
    uVar4 = pTVar7->m_textureSpec->type - TEXTURETYPE_2D;
    uVar14 = 0;
    if (uVar4 < 6) {
      uVar14 = *(uint *)(&DAT_0099a7c8 + (ulong)uVar4 * 4);
    }
    pIVar9 = Context::getInstanceInterface
                       ((pTVar7->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
    pVVar10 = Context::getPhysicalDevice
                        ((pTVar7->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
    iVar5 = (*pIVar9->_vptr_InstanceInterface[4])
                      (pIVar9,pVVar10,(ulong)format,(ulong)uVar14,0,6,(ulong)uVar23 << 0x20,
                       (TextureFormat *)local_1b0);
    if (iVar5 == -0xb) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,"Format not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureFunctionTests.cpp"
                 ,0x7ca);
    }
    else {
      for (lVar15 = 0; lVar15 != 0x18; lVar15 = lVar15 + 4) {
        if ((local_19c &
            *(uint *)((long)&sr::(anonymous_namespace)::TextureSamplesInstance::
                             TextureSamplesInstance(vkt::Context&,bool,vkt::sr::(anonymous_namespace)::TextureSpec_const&)
                             ::sampleFlags + lVar15)) != 0) {
          std::vector<vk::VkSampleCountFlagBits,_std::allocator<vk::VkSampleCountFlagBits>_>::
          push_back((vector<vk::VkSampleCountFlagBits,_std::allocator<vk::VkSampleCountFlagBits>_> *
                    )&pTVar7[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context,
                    (value_type *)
                    ((long)&sr::(anonymous_namespace)::TextureSamplesInstance::
                            TextureSamplesInstance(vkt::Context&,bool,vkt::sr::(anonymous_namespace)::TextureSpec_const&)
                            ::sampleFlags + lVar15));
        }
      }
      if (pTVar7[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context !=
          *(Context **)&pTVar7[1].super_ShaderRenderCaseInstance.m_imageBackingMode) {
LAB_0060214f:
        pTVar2 = ((pTVar7->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->m_testCtx
                 ->m_log;
        local_1f8.m_data[2] = pTVar7->m_textureSpec->depth;
        pIVar13 = *(IVec3 **)&pTVar7->m_textureSpec->width;
        textureBinding.m_ptr = (TextureBinding *)0x0;
        textureBinding.m_state = (SharedPtrStateBase *)0x0;
        local_1b0._0_4_ = SUB84(pTVar2,0);
        local_1b0._4_4_ = (undefined4)((ulong)pTVar2 >> 0x20);
        local_1f8.m_data._0_8_ = pIVar13;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::operator<<((ostream *)local_1a8,"Image size: ");
        sr::(anonymous_namespace)::getTextureSizeString_abi_cxx11_
                  (&local_1d8,(_anonymous_namespace_ *)(ulong)pTVar7->m_textureSpec->type,
                   (TextureType)&local_1f8,pIVar13);
        std::operator<<((ostream *)local_1a8,(string *)&local_1d8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        pTVar3 = pTVar7->m_textureSpec;
        createEmptyTexture((anon_unknown_0 *)local_1b0,pTVar3->format,pTVar3->type,&local_1f8,
                           pTVar3->numLevels,0,&pTVar3->sampler);
        de::SharedPtr<vkt::sr::TextureBinding>::operator=
                  (&textureBinding,(SharedPtr<vkt::sr::TextureBinding> *)local_1b0);
        de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr
                  ((SharedPtr<vkt::sr::TextureBinding> *)local_1b0);
        std::
        vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
        ::push_back(&(pTVar7->super_ShaderRenderCaseInstance).m_textures,&textureBinding);
        de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&textureBinding);
        return (TestInstance *)pTVar7;
      }
      TVar8 = ::vk::mapVkFormat(format);
      TVar6 = tcu::getTextureChannelClass(TVar8.type);
      if (TVar6 != TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
        TVar8 = ::vk::mapVkFormat(format);
        TVar6 = tcu::getTextureChannelClass(TVar8.type);
        if (TVar6 != TEXTURECHANNELCLASS_SIGNED_INTEGER) goto LAB_0060214f;
      }
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_01,
                 "Skipping validation of integer formats as only VK_SAMPLE_COUNT_1_BIT is supported."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureFunctionTests.cpp"
                 ,0x7f2);
    }
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  default:
    return (TestInstance *)0x0;
  }
  fVar16 = (float)((pVVar12->limits).mipmapPrecisionBits * -0x800000 + 0x3f800000) + 0.008;
  switch(pTVar3->type) {
  default:
    fVar17 = ((float)pTVar3->width *
             ((this_00->m_maxCoord).m_data[0] - (this_00->m_minCoord).m_data[0])) /
             (float)(uint)local_1d8._M_dataplus._M_p;
    fVar19 = TextureTestUtil::computeLodFromDerivates(mode,fVar17,0.0);
    (this_00->m_lodBounds).m_data[0] = fVar19 - fVar16;
    local_204 = TextureTestUtil::computeLodFromDerivates(mode,fVar17,0.0);
    break;
  case TEXTURETYPE_2D:
  case TEXTURETYPE_2D_ARRAY:
    fVar19 = ((float)pTVar3->width *
             ((this_00->m_maxCoord).m_data[0] - (this_00->m_minCoord).m_data[0])) /
             (float)(uint)local_1d8._M_dataplus._M_p;
    fVar18 = ((float)pTVar3->height *
             ((this_00->m_maxCoord).m_data[1] - (this_00->m_minCoord).m_data[1])) /
             (float)local_1d8._M_dataplus._M_p._4_4_;
    fVar17 = TextureTestUtil::computeLodFromDerivates(LODMODE_MIN_BOUND,fVar19,0.0,0.0,fVar18);
    (this_00->m_lodBounds).m_data[0] = fVar17 - fVar16;
    goto LAB_006023ed;
  case TEXTURETYPE_3D:
    fVar19 = ((float)pTVar3->width *
             ((this_00->m_maxCoord).m_data[0] - (this_00->m_minCoord).m_data[0])) /
             (float)(uint)local_1d8._M_dataplus._M_p;
    fVar18 = ((float)pTVar3->height *
             ((this_00->m_maxCoord).m_data[1] - (this_00->m_minCoord).m_data[1])) /
             (float)local_1d8._M_dataplus._M_p._4_4_;
    local_1b4 = (float)pTVar3->depth *
                ((this_00->m_maxCoord).m_data[2] - (this_00->m_minCoord).m_data[2]) * 0.5;
    local_1b8 = local_1b4 / (float)(uint)local_1d8._M_dataplus._M_p;
    local_1b4 = local_1b4 / (float)local_1d8._M_dataplus._M_p._4_4_;
    fVar17 = TextureTestUtil::computeLodFromDerivates
                       (LODMODE_MIN_BOUND,fVar19,0.0,local_1b8,0.0,fVar18,local_1b4);
    (this_00->m_lodBounds).m_data[0] = fVar17 - fVar16;
    local_204 = TextureTestUtil::computeLodFromDerivates
                          (LODMODE_MAX_BOUND,fVar19,0.0,local_1b8,0.0,fVar18,local_1b4);
    break;
  case TEXTURETYPE_CUBE_MAP:
  case TEXTURETYPE_CUBE_ARRAY:
    local_1a8[0] = (this_00->m_minCoord).m_data[2];
    uVar1 = *(undefined8 *)(this_00->m_minCoord).m_data;
    local_1b0._0_4_ = (undefined4)uVar1;
    local_1b0._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    CVar20 = tcu::getCubeFaceCoords((Vec3 *)local_1b0);
    local_1b0._0_4_ = (this_00->m_maxCoord).m_data[0];
    uVar1 = *(undefined8 *)((this_00->m_minCoord).m_data + 1);
    local_1b0._4_4_ = (undefined4)uVar1;
    local_1a8[0] = (float)((ulong)uVar1 >> 0x20);
    CVar21 = tcu::getCubeFaceCoords((Vec3 *)local_1b0);
    local_1b0._4_4_ = (this_00->m_maxCoord).m_data[1];
    local_1b0._0_4_ = (this_00->m_minCoord).m_data[0];
    local_1a8[0] = (this_00->m_minCoord).m_data[2];
    CVar22 = tcu::getCubeFaceCoords((Vec3 *)local_1b0);
    pTVar3 = (this_00->super_TextureQueryInstance).m_textureSpec;
    fVar19 = ((float)pTVar3->width * (CVar21.s - CVar20.s)) /
             (float)(uint)local_1d8._M_dataplus._M_p;
    fVar18 = ((float)pTVar3->height * (CVar22.t - CVar20.t)) /
             (float)local_1d8._M_dataplus._M_p._4_4_;
    fVar17 = TextureTestUtil::computeLodFromDerivates(LODMODE_MIN_BOUND,fVar19,0.0,0.0,fVar18);
    (this_00->m_lodBounds).m_data[0] = fVar17 - fVar16;
LAB_006023ed:
    local_204 = TextureTestUtil::computeLodFromDerivates(LODMODE_MAX_BOUND,fVar19,0.0,0.0,fVar18);
  }
  local_204 = local_204 + fVar16;
  (this_00->m_lodBounds).m_data[1] = local_204;
LAB_006024f3:
  fVar16 = TextureQueryLodInstance::computeLevelFromLod(this_00,(this_00->m_lodBounds).m_data[0]);
  (this_00->m_levelBounds).m_data[0] = fVar16;
  fVar16 = TextureQueryLodInstance::computeLevelFromLod(this_00,local_204);
  (this_00->m_levelBounds).m_data[1] = fVar16;
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureQueryCase::createInstance (Context& context) const
{
	switch (m_function)
	{
		case QUERYFUNCTION_TEXTURESIZE:				return new TextureSizeInstance(context, m_isVertexCase, m_textureSpec);
		case QUERYFUNCTION_TEXTUREQUERYLOD:			return new TextureQueryLodInstance(context, m_isVertexCase, m_textureSpec);
		case QUERYFUNCTION_TEXTUREQUERYLEVELS:		return new TextureQueryLevelsInstance(context, m_isVertexCase, m_textureSpec);
		case QUERYFUNCTION_TEXTURESAMPLES:			return new TextureSamplesInstance(context, m_isVertexCase, m_textureSpec);
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}